

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void pnga_zero_patch(Integer g_a,Integer *lo,Integer *hi)

{
  int iVar1;
  undefined8 *val;
  bool bVar2;
  float fval;
  int ival;
  double dval;
  long llval;
  long lval;
  Integer type;
  Integer ndim;
  Integer dims [7];
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Integer local_78;
  Integer local_70;
  Integer local_68 [8];
  
  iVar1 = _ga_sync_end;
  val = (undefined8 *)&local_a8;
  local_a4 = 0;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_a8 = 0;
  _ga_sync_end = 1;
  bVar2 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  if (bVar2) {
    pnga_sync();
  }
  pnga_inquire(g_a,&local_78,&local_70,local_68);
  switch(local_78) {
  case 0x3e9:
    val = (undefined8 *)&local_a4;
    break;
  case 0x3ea:
    val = &local_90;
    break;
  case 0x3eb:
    break;
  case 0x3ec:
    val = &local_a0;
    break;
  default:
    pnga_error(" wrong data type ",local_78);
    val = (undefined8 *)0x0;
    break;
  case 0x3ee:
    val = &local_88;
    local_88 = 0;
    break;
  case 0x3ef:
    val = &local_88;
    local_88 = 0;
    uStack_80 = 0;
    break;
  case 0x3f8:
    val = &local_98;
  }
  pnga_fill_patch(g_a,lo,hi,val);
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_zero_patch(Integer g_a, Integer *lo, Integer *hi)
{
    Integer ndim, dims[MAXDIM], type;
    int ival = 0;
    long lval = 0; 
    long llval = 0; 
    double dval = 0.0;
    DoubleComplex cval;
    SingleComplex cfval;
    float fval = 0.0;
    void *valptr = NULL;
    int local_sync_begin,local_sync_end;
    
    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    
    pnga_inquire(g_a,  &type, &ndim, dims);
    
    switch (type){
        case C_INT:
            valptr = (void *)(&ival);
            break;
        case C_DBL:
            valptr = (void *)(&dval);
            break;
        case C_DCPL:
        {
            cval.real = 0.0; cval.imag = 0.0;
            valptr = (void *)(&cval);
            break;
        }
        case C_SCPL:
        {
            cfval.real = 0.0; cfval.imag = 0.0;
            valptr = (void *)(&cfval);
            break;
        }
        case C_FLOAT:
            valptr = (void *)(&fval);
            break;      
       case C_LONG:
            valptr = (void *)(&lval);
            break; 
       case C_LONGLONG:
            valptr = (void *)(&llval);
            break; 
        default: pnga_error(" wrong data type ",type);
    }
    pnga_fill_patch(g_a, lo, hi, valptr);
    
    if(local_sync_end)pnga_sync();
}